

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_interface.c
# Opt level: O0

fe_t * fe_init_auto_r(cmd_ln_t *config)

{
  int iVar1;
  int16 *piVar2;
  window_t *pwVar3;
  melfb_t *pmVar4;
  noise_stats_t *pnVar5;
  frame_t *pfVar6;
  powspec_t *ppVar7;
  fe_t *fe;
  cmd_ln_t *config_local;
  
  config_local = (cmd_ln_t *)
                 __ckd_calloc__(1,0x88,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                                ,0xdd);
  ((fe_t *)config_local)->refcount = 1;
  iVar1 = fe_parse_general_params(config,(fe_t *)config_local);
  if (iVar1 < 0) {
    fe_free((fe_t *)config_local);
    config_local = (cmd_ln_t *)0x0;
  }
  else {
    ((fe_t *)config_local)->frame_shift =
         (int16)(int)((float)((fe_t *)config_local)->sampling_rate /
                      (float)(int)((fe_t *)config_local)->frame_rate + 0.5);
    ((fe_t *)config_local)->frame_size =
         (int16)(int)((float)((fe_t *)config_local)->window_length *
                      (float)((fe_t *)config_local)->sampling_rate + 0.5);
    ((fe_t *)config_local)->pre_emphasis_prior = 0;
    if (((fe_t *)config_local)->frame_shift < 2) {
      __assert_fail("fe->frame_shift > 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                    ,0xee,"fe_t *fe_init_auto_r(cmd_ln_t *)");
    }
    if (((fe_t *)config_local)->frame_size < ((fe_t *)config_local)->frame_shift) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
              ,0xf2,"Frame size %d (-wlen) must be greater than frame shift %d (-frate)\n",
              (ulong)(uint)(int)((fe_t *)config_local)->frame_size,
              (ulong)(uint)(int)((fe_t *)config_local)->frame_shift);
      fe_free((fe_t *)config_local);
      config_local = (cmd_ln_t *)0x0;
    }
    else if (((fe_t *)config_local)->fft_size < ((fe_t *)config_local)->frame_size) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
              ,0xfa,"Number of FFT points has to be a power of 2 higher than %d, it is %d\n",
              (ulong)(uint)(int)((fe_t *)config_local)->frame_size,
              (ulong)(uint)(int)((fe_t *)config_local)->fft_size);
      fe_free((fe_t *)config_local);
      config_local = (cmd_ln_t *)0x0;
    }
    else {
      if (((fe_t *)config_local)->dither != '\0') {
        fe_init_dither(((fe_t *)config_local)->dither_seed);
      }
      piVar2 = (int16 *)__ckd_calloc__((long)((fe_t *)config_local)->frame_size,4,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                                       ,0x103);
      ((fe_t *)config_local)->overflow_samps = piVar2;
      pwVar3 = (window_t *)
               __ckd_calloc__((long)((int)((fe_t *)config_local)->frame_size / 2),8,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                              ,0x104);
      ((fe_t *)config_local)->hamming_window = pwVar3;
      fe_create_hamming(((fe_t *)config_local)->hamming_window,
                        (int)((fe_t *)config_local)->frame_size);
      pmVar4 = (melfb_t *)
               __ckd_calloc__(1,0x78,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                              ,0x10a);
      ((fe_t *)config_local)->mel_fb = pmVar4;
      fe_parse_melfb_params(config,(fe_t *)config_local,((fe_t *)config_local)->mel_fb);
      if ((float)((fe_t *)config_local)->mel_fb->upper_filt_freq <=
          (float)((fe_t *)config_local)->sampling_rate / 2.0 + 1.0) {
        fe_build_melfilters(((fe_t *)config_local)->mel_fb);
        fe_compute_melcosine(((fe_t *)config_local)->mel_fb);
        iVar1 = ps_config_bool(config,"remove_noise");
        if (iVar1 != 0) {
          pnVar5 = fe_init_noisestats(((fe_t *)config_local)->mel_fb->num_filters);
          ((fe_t *)config_local)->noise_stats = pnVar5;
        }
        piVar2 = (int16 *)__ckd_calloc__((long)((fe_t *)config_local)->frame_size,2,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                                         ,0x11d);
        ((fe_t *)config_local)->spch = piVar2;
        pfVar6 = (frame_t *)
                 __ckd_calloc__((long)((fe_t *)config_local)->fft_size,8,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                                ,0x11e);
        ((fe_t *)config_local)->frame = pfVar6;
        ppVar7 = (powspec_t *)
                 __ckd_calloc__((long)((fe_t *)config_local)->fft_size,8,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                                ,0x11f);
        ((fe_t *)config_local)->spec = ppVar7;
        ppVar7 = (powspec_t *)
                 __ckd_calloc__((long)((fe_t *)config_local)->mel_fb->num_filters,8,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                                ,0x120);
        ((fe_t *)config_local)->mfspec = ppVar7;
        pfVar6 = (frame_t *)
                 __ckd_calloc__((long)((int)((fe_t *)config_local)->fft_size / 4),8,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                                ,0x123);
        ((fe_t *)config_local)->ccc = pfVar6;
        pfVar6 = (frame_t *)
                 __ckd_calloc__((long)((int)((fe_t *)config_local)->fft_size / 4),8,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                                ,0x124);
        ((fe_t *)config_local)->sss = pfVar6;
        fe_create_twiddle((fe_t *)config_local);
        iVar1 = ps_config_bool(config,"verbose");
        if (iVar1 != 0) {
          fe_print_current((fe_t *)config_local);
        }
        fe_start_utt((fe_t *)config_local);
      }
      else {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                ,0x111,"Upper frequency %.1f is higher than samprate/2 (%.1f)\n",
                (double)(float)((fe_t *)config_local)->mel_fb->upper_filt_freq,
                (double)((float)((fe_t *)config_local)->sampling_rate / 2.0));
        fe_free((fe_t *)config_local);
        config_local = (cmd_ln_t *)0x0;
      }
    }
  }
  return (fe_t *)config_local;
}

Assistant:

fe_t *
fe_init_auto_r(cmd_ln_t *config)
{
    fe_t *fe;

    fe = (fe_t*)ckd_calloc(1, sizeof(*fe));
    fe->refcount = 1;

    /* transfer params to front end */
    if (fe_parse_general_params(config, fe) < 0) {
        fe_free(fe);
        return NULL;
    }

    /* compute remaining fe parameters */
    /* We add 0.5 so approximate the float with the closest
     * integer. E.g., 2.3 is truncate to 2, whereas 3.7 becomes 4
     */
    fe->frame_shift = (int32) (fe->sampling_rate / fe->frame_rate + 0.5);
    fe->frame_size = (int32) (fe->window_length * fe->sampling_rate + 0.5);
    fe->pre_emphasis_prior = 0;

    assert (fe->frame_shift > 1);
    if (fe->frame_size < fe->frame_shift) {
        E_ERROR
            ("Frame size %d (-wlen) must be greater than frame shift %d (-frate)\n",
             fe->frame_size, fe->frame_shift);
        fe_free(fe);
        return NULL;
    }

    if (fe->frame_size > (fe->fft_size)) {
        E_ERROR
            ("Number of FFT points has to be a power of 2 higher than %d, it is %d\n",
             fe->frame_size, fe->fft_size);
        fe_free(fe);
        return NULL;
    }

    if (fe->dither)
        fe_init_dither(fe->dither_seed);

    /* establish buffers for overflow samps and hamming window */
    fe->overflow_samps = ckd_calloc(fe->frame_size, sizeof(float32));
    fe->hamming_window = ckd_calloc(fe->frame_size/2, sizeof(window_t));

    /* create hamming window */
    fe_create_hamming(fe->hamming_window, fe->frame_size);

    /* init and fill appropriate filter structure */
    fe->mel_fb = ckd_calloc(1, sizeof(*fe->mel_fb));

    /* transfer params to mel fb */
    fe_parse_melfb_params(config, fe, fe->mel_fb);
    
    if (fe->mel_fb->upper_filt_freq > fe->sampling_rate / 2 + 1.0) {
	E_ERROR("Upper frequency %.1f is higher than samprate/2 (%.1f)\n", 
		fe->mel_fb->upper_filt_freq, fe->sampling_rate / 2);
	fe_free(fe);
	return NULL;
    }
    
    fe_build_melfilters(fe->mel_fb);
    fe_compute_melcosine(fe->mel_fb);
    if (ps_config_bool(config, "remove_noise"))
        fe->noise_stats = fe_init_noisestats(fe->mel_fb->num_filters);

    /* Create temporary FFT, spectrum and mel-spectrum buffers. */
    /* FIXME: Gosh there are a lot of these. */
    fe->spch = ckd_calloc(fe->frame_size, sizeof(*fe->spch));
    fe->frame = ckd_calloc(fe->fft_size, sizeof(*fe->frame));
    fe->spec = ckd_calloc(fe->fft_size, sizeof(*fe->spec));
    fe->mfspec = ckd_calloc(fe->mel_fb->num_filters, sizeof(*fe->mfspec));

    /* create twiddle factors */
    fe->ccc = ckd_calloc(fe->fft_size / 4, sizeof(*fe->ccc));
    fe->sss = ckd_calloc(fe->fft_size / 4, sizeof(*fe->sss));
    fe_create_twiddle(fe);

    if (ps_config_bool(config, "verbose")) {
        fe_print_current(fe);
    }

    /*** Initialize the overflow buffers ***/
    fe_start_utt(fe);
    return fe;
}